

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O0

void __thiscall
btHingeConstraint::testLimit(btHingeConstraint *this,btTransform *transA,btTransform *transB)

{
  btAngularLimit *in_RDI;
  btScalar bVar1;
  btTransform *in_stack_00000070;
  btTransform *in_stack_00000078;
  btHingeConstraint *in_stack_00000080;
  btScalar in_stack_ffffffffffffffdc;
  
  bVar1 = getHingeAngle(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  in_RDI[0x17].m_relaxationFactor = bVar1;
  btAngularLimit::test(in_RDI,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

void btHingeConstraint::testLimit(const btTransform& transA,const btTransform& transB)
{
	// Compute limit information
	m_hingeAngle = getHingeAngle(transA,transB);
#ifdef	_BT_USE_CENTER_LIMIT_
	m_limit.test(m_hingeAngle);
#else
	m_correction = btScalar(0.);
	m_limitSign = btScalar(0.);
	m_solveLimit = false;
	if (m_lowerLimit <= m_upperLimit)
	{
		m_hingeAngle = btAdjustAngleToLimits(m_hingeAngle, m_lowerLimit, m_upperLimit);
		if (m_hingeAngle <= m_lowerLimit)
		{
			m_correction = (m_lowerLimit - m_hingeAngle);
			m_limitSign = 1.0f;
			m_solveLimit = true;
		} 
		else if (m_hingeAngle >= m_upperLimit)
		{
			m_correction = m_upperLimit - m_hingeAngle;
			m_limitSign = -1.0f;
			m_solveLimit = true;
		}
	}
#endif
	return;
}